

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  allocator local_51;
  string local_50;
  
  if (1 < argc) {
    uVar1 = 1;
    do {
      std::__cxx11::string::string((string *)&local_50,argv[uVar1],&local_51);
      unzip(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int rv = 0;
  for (int i = 1; i < argc; i++) {
    rv = unzip(argv[i]);
    if (rv != 0) {
      return rv;
    }
  }
  return rv;
}